

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

SRCINFO * __thiscall Js::ScriptContext::GetModuleSrcInfo(ScriptContext *this,ModuleID moduleID)

{
  Recycler *pRVar1;
  WriteBarrierPtr<const_SRCINFO> *pWVar2;
  ulong dstCount;
  Cache *pCVar3;
  SRCINFO **ppSVar4;
  WriteBarrierPtr<const_SRCINFO> **ppWVar5;
  SRCINFO *pSVar6;
  TrackAllocData local_90;
  SRCINFO *local_68;
  SRCINFO *newSrcInfo;
  SRCINFO *si;
  undefined8 local_50;
  TrackAllocData local_48;
  WriteBarrierPtr<const_SRCINFO> *local_20;
  Type *newModuleSrcInfo;
  uint newCount;
  ModuleID moduleID_local;
  ScriptContext *this_local;
  
  newModuleSrcInfo._4_4_ = moduleID;
  _newCount = this;
  if (this->moduleSrcInfoCount <= moduleID) {
    newModuleSrcInfo._0_4_ = moduleID + 4;
    pRVar1 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&Memory::WriteBarrierPtr<SRCINFO_const>::typeinfo,0,
               (ulong)(uint)newModuleSrcInfo,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
               ,0xc32);
    pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
    si = (SRCINFO *)Memory::Recycler::AllocZero;
    local_50 = 0;
    pWVar2 = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<SRCINFO_const>,false>
                       ((Memory *)pRVar1,(Recycler *)Memory::Recycler::AllocZero,0,
                        (ulong)(uint)newModuleSrcInfo);
    dstCount = (ulong)(uint)newModuleSrcInfo;
    local_20 = pWVar2;
    pCVar3 = Cache(this);
    Memory::
    CopyArray<Memory::WriteBarrierPtr<SRCINFO_const>,Memory::WriteBarrierPtr<SRCINFO_const>,Memory::Recycler>
              (pWVar2,dstCount,&pCVar3->moduleSrcInfo,(ulong)this->moduleSrcInfoCount);
    pWVar2 = local_20;
    pCVar3 = Cache(this);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<const_SRCINFO>_>::operator=
              (&pCVar3->moduleSrcInfo,pWVar2);
    this->moduleSrcInfoCount = (uint)newModuleSrcInfo;
    pCVar3 = Cache(this);
    ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SRCINFO__
                        ((WriteBarrierPtr *)&pCVar3->noContextGlobalSourceInfo);
    pSVar6 = *ppSVar4;
    pCVar3 = Cache(this);
    ppWVar5 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)&pCVar3->moduleSrcInfo);
    Memory::WriteBarrierPtr<const_SRCINFO>::operator=(*ppWVar5,pSVar6);
  }
  pCVar3 = Cache(this);
  ppWVar5 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&pCVar3->moduleSrcInfo);
  ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SRCINFO__
                      ((WriteBarrierPtr *)(*ppWVar5 + newModuleSrcInfo._4_4_));
  newSrcInfo = *ppSVar4;
  if (newSrcInfo == (SRCINFO *)0x0) {
    pRVar1 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_90,(type_info *)&SRCINFO::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
               ,0xc3c);
    pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_90);
    pSVar6 = (SRCINFO *)new<Memory::Recycler>(0x28,pRVar1,0x744a10);
    SRCINFO::SRCINFO(pSVar6);
    local_68 = pSVar6;
    pCVar3 = Cache(this);
    Memory::WriteBarrierPtr<SourceContextInfo>::operator=
              (&local_68->sourceContextInfo,&pCVar3->noContextSourceContextInfo);
    pSVar6 = local_68;
    local_68->moduleID = newModuleSrcInfo._4_4_;
    pCVar3 = Cache(this);
    ppWVar5 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)&pCVar3->moduleSrcInfo);
    Memory::WriteBarrierPtr<const_SRCINFO>::operator=(*ppWVar5 + newModuleSrcInfo._4_4_,pSVar6);
    newSrcInfo = local_68;
  }
  return newSrcInfo;
}

Assistant:

SRCINFO const *
        ScriptContext::GetModuleSrcInfo(Js::ModuleID moduleID)
    {
            if (moduleSrcInfoCount <= moduleID)
            {
                uint newCount = moduleID + 4;  // Preallocate 4 more slots, moduleID don't usually grow much

                Field(SRCINFO const *)* newModuleSrcInfo = RecyclerNewArrayZ(this->GetRecycler(), Field(SRCINFO const*), newCount);
                CopyArray(newModuleSrcInfo, newCount, Cache()->moduleSrcInfo, moduleSrcInfoCount);
                Cache()->moduleSrcInfo = newModuleSrcInfo;
                moduleSrcInfoCount = newCount;
                Cache()->moduleSrcInfo[0] = this->Cache()->noContextGlobalSourceInfo;
            }

            SRCINFO const * si = Cache()->moduleSrcInfo[moduleID];
            if (si == nullptr)
            {
                SRCINFO * newSrcInfo = RecyclerNewStructZ(this->GetRecycler(), SRCINFO);
                newSrcInfo->sourceContextInfo = this->Cache()->noContextSourceContextInfo;
                newSrcInfo->moduleID = moduleID;
                Cache()->moduleSrcInfo[moduleID] = newSrcInfo;
                si = newSrcInfo;
            }
            return si;
    }